

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

pair<unsigned_long,_unsigned_long> WeakHashLen32WithSeeds(char *s,uint64 a,uint64 b)

{
  uint64 b_00;
  uint64 a_00;
  uint64 in_RDX;
  uint64 in_RSI;
  uint64 in_RDI;
  pair<unsigned_long,_unsigned_long> pVar1;
  uint64 in_stack_fffffffffffffff0;
  
  Fetch64((char *)0x25349d);
  b_00 = Fetch64((char *)0x2534b0);
  a_00 = Fetch64((char *)0x2534c3);
  Fetch64((char *)0x2534d6);
  pVar1 = WeakHashLen32WithSeeds(in_stack_fffffffffffffff0,in_RDI,in_RSI,in_RDX,a_00,b_00);
  return pVar1;
}

Assistant:

static pair<uint64, uint64> WeakHashLen32WithSeeds(
    const char* s, uint64 a, uint64 b) {
  return WeakHashLen32WithSeeds(Fetch64(s),
                                Fetch64(s + 8),
                                Fetch64(s + 16),
                                Fetch64(s + 24),
                                a,
                                b);
}